

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O2

void __thiscall
duckdb::FixedSizeBuffer::SetAllocationSize
          (FixedSizeBuffer *this,idx_t available_segments,idx_t segment_size,idx_t bitmask_offset)

{
  idx_t iVar1;
  ulong uVar2;
  idx_t iVar3;
  ValidityMask mask;
  
  if (this->dirty == true) {
    mask.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)Get(this,true);
    mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iVar3 = available_segments;
    do {
      uVar2 = iVar3;
      iVar1 = available_segments;
      if (uVar2 == 0) break;
      iVar3 = uVar2 - 1;
    } while ((mask.super_TemplatedValidityMask<unsigned_long>.validity_mask == (unsigned_long *)0x0)
            || (iVar1 = uVar2,
               (mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar3 >> 6] >>
                (iVar3 & 0x3f) & 1) != 0));
    this->allocation_size = iVar1 * segment_size + bitmask_offset;
    mask.super_TemplatedValidityMask<unsigned_long>.capacity = available_segments;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

void FixedSizeBuffer::SetAllocationSize(const idx_t available_segments, const idx_t segment_size,
                                        const idx_t bitmask_offset) {
	if (!dirty) {
		return;
	}

	// We traverse from the back. A binary search would be faster.
	// However, buffers are often (almost) full, so the overhead is acceptable.
	auto bitmask_ptr = reinterpret_cast<validity_t *>(Get());
	ValidityMask mask(bitmask_ptr, available_segments);

	auto max_offset = available_segments;
	for (idx_t i = available_segments; i > 0; i--) {
		if (!mask.RowIsValid(i - 1)) {
			max_offset = i;
			break;
		}
	}
	allocation_size = max_offset * segment_size + bitmask_offset;
}